

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ManTruthQuit(void)

{
  int *piVar1;
  Vec_Mem_t *__ptr;
  long lVar2;
  
  if (s_vTtMem != (Vec_Mem_t *)0x0) {
    printf("TT = %d (%.2f %%)\n",((double)s_vTtMem->nEntries * 100.0) / (double)s_nCalls);
    __ptr = s_vTtMem;
    if (s_vTtMem != (Vec_Mem_t *)0x0) {
      if (s_vTtMem->vTable != (Vec_Int_t *)0x0) {
        piVar1 = s_vTtMem->vTable->pArray;
        if (piVar1 != (int *)0x0) {
          free(piVar1);
          __ptr->vTable->pArray = (int *)0x0;
        }
        if (__ptr->vTable != (Vec_Int_t *)0x0) {
          free(__ptr->vTable);
          __ptr->vTable = (Vec_Int_t *)0x0;
        }
      }
      if (__ptr->vNexts != (Vec_Int_t *)0x0) {
        piVar1 = __ptr->vNexts->pArray;
        if (piVar1 != (int *)0x0) {
          free(piVar1);
          __ptr->vNexts->pArray = (int *)0x0;
        }
        if (__ptr->vNexts != (Vec_Int_t *)0x0) {
          free(__ptr->vNexts);
          __ptr->vNexts = (Vec_Int_t *)0x0;
        }
      }
    }
    if (-1 < __ptr->iPage) {
      lVar2 = -1;
      do {
        if (__ptr->ppPages[lVar2 + 1] != (word *)0x0) {
          free(__ptr->ppPages[lVar2 + 1]);
          __ptr->ppPages[lVar2 + 1] = (word *)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < __ptr->iPage);
    }
    if (__ptr->ppPages != (word **)0x0) {
      free(__ptr->ppPages);
      __ptr->ppPages = (word **)0x0;
    }
    if (__ptr != (Vec_Mem_t *)0x0) {
      free(__ptr);
    }
    s_vTtMem = (Vec_Mem_t *)0x0;
    s_nCalls = 0;
  }
  return;
}

Assistant:

void Mf_ManTruthQuit()
{
    if ( s_vTtMem == NULL )
        return;
    printf( "TT = %d (%.2f %%)\n", Vec_MemEntryNum(s_vTtMem), 100.0 * Vec_MemEntryNum(s_vTtMem) / s_nCalls );
    Vec_MemHashFree( s_vTtMem );
    Vec_MemFree( s_vTtMem );
    s_vTtMem = NULL;
    s_nCalls = 0;
}